

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void pop_symbol(Context_conflict *ctx,SymbolMap *map)

{
  SymbolScope *ptr;
  SymbolScope *item;
  SymbolMap *map_local;
  Context_conflict *ctx_local;
  
  ptr = map->scope;
  if (ptr != (SymbolScope *)0x0) {
    if (ptr->symbol != (char *)0x0) {
      hash_remove(map->hash,ptr->symbol);
    }
    map->scope = ptr->next;
    Free(ctx,ptr);
  }
  return;
}

Assistant:

static void pop_symbol(Context *ctx, SymbolMap *map)
{
    SymbolScope *item = map->scope;
    if (!item)
        return;
    if (item->symbol)
        hash_remove(map->hash, item->symbol);
    map->scope = item->next;
    Free(ctx, item);
}